

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonProcessingFunctions.cpp
# Opt level: O3

json __thiscall helics::fileops::loadJson(fileops *this,string *jsonString)

{
  char cVar1;
  json_value extraout_RDX;
  string_view jsonString_00;
  string_view jsonString_01;
  json jVar3;
  ifstream file;
  _Any_data local_248;
  code *local_238;
  undefined8 uStack_230;
  basic_ifstream<char,_std::char_traits<char>_> local_220 [520];
  json_value jVar2;
  
  if ((char *)jsonString->_M_string_length < (char *)0x81) {
    std::ifstream::ifstream(local_220,(string *)jsonString,_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      jsonString_01._M_str = (char *)jsonString->_M_string_length;
      jsonString_01._M_len = (size_t)this;
      loadJsonStr_abi_cxx11_(jsonString_01);
    }
    else {
      local_238 = (code *)0x0;
      uStack_230 = 0;
      local_248._M_unused._M_object = (void *)0x0;
      local_248._8_8_ = 0;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::parse<std::ifstream&>
                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  *)this,local_220,(parser_callback_t *)&local_248,true,true);
      if (local_238 != (code *)0x0) {
        (*local_238)(&local_248,&local_248,__destroy_functor);
      }
    }
    std::ifstream::~ifstream(local_220);
    jVar2 = extraout_RDX;
  }
  else {
    jsonString_00._M_str = (char *)jsonString->_M_string_length;
    jsonString_00._M_len = (size_t)this;
    jVar3 = loadJsonStr_abi_cxx11_(jsonString_00);
    jVar2 = jVar3.m_data.m_value;
  }
  jVar3.m_data.m_value.string = jVar2.string;
  jVar3.m_data._0_8_ = this;
  return (json)jVar3.m_data;
}

Assistant:

nlohmann::json loadJson(const std::string& jsonString)
{
    if (jsonString.size() > 128) {
        try {
            return loadJsonStr(jsonString);
        }
        catch (const std::invalid_argument&) {
            // this was a guess lets try a file now, the same error will be generated again later as
            // well
        }
    }
    std::ifstream file(jsonString);

    if (file.is_open()) {
        try {
            return nlohmann::json::parse(file, nullptr, true, true);
        }
        catch (const nlohmann::json::parse_error& errs) {
            throw(std::invalid_argument(errs.what()));
        }
    }
    return loadJsonStr(jsonString);
}